

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O2

ztast_expr_t * ztast_expr_from_scope(ztast_t *ast,ztast_scope_t *scope)

{
  ztast_expr_t *pzVar1;
  
  pzVar1 = (ztast_expr_t *)(*ast->mallocfn)(0x10,ast->opaque);
  if (pzVar1 != (ztast_expr_t *)0x0) {
    pzVar1->type = ZTEXPR_SCOPE;
    (pzVar1->data).value = (ztast_value *)scope;
  }
  return pzVar1;
}

Assistant:

ztast_expr_t *ztast_expr_from_scope(ztast_t *ast, ztast_scope_t *scope)
{
  ztast_expr_t *expr;

  assert(ast);
  assert(scope);

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_expr_from_scope\n");
#endif

  expr = ZTAST_MALLOC(sizeof(*expr));
  if (expr == NULL)
    return NULL;

  expr->type       = ZTEXPR_SCOPE;
  expr->data.scope = scope;

  return expr;
}